

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

bool __thiscall
TPZMatrix<std::complex<long_double>_>::Compare
          (TPZMatrix<std::complex<long_double>_> *this,TPZSavable *copy,bool override)

{
  undefined2 uVar1;
  int64_t iVar2;
  long lVar3;
  ostream *poVar4;
  stringstream sout;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  if (copy != (TPZSavable *)0x0) {
    lVar3 = __dynamic_cast(copy,&TPZSavable::typeinfo,
                           &TPZMatrix<std::complex<long_double>>::typeinfo,0);
    if (lVar3 == 0) {
      return false;
    }
    if ((((this->super_TPZBaseMatrix).fRow == *(long *)(lVar3 + 8)) &&
        ((this->super_TPZBaseMatrix).fCol == *(long *)(lVar3 + 0x10))) &&
       ((this->super_TPZBaseMatrix).fDecomposed == *(char *)(lVar3 + 0x18))) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,
               "virtual bool TPZMatrix<std::complex<long double>>::Compare(TPZSavable *, bool) [T = std::complex<long double>]"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>(local_198," did not compare ",0x11);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1c8,local_1c0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    if (override) {
      uVar1 = *(undefined2 *)(lVar3 + 0x18);
      (this->super_TPZBaseMatrix).fDecomposed = (char)uVar1;
      (this->super_TPZBaseMatrix).fDefPositive = (char)((ushort)uVar1 >> 8);
      iVar2 = *(int64_t *)(lVar3 + 0x10);
      (this->super_TPZBaseMatrix).fRow = *(int64_t *)(lVar3 + 8);
      (this->super_TPZBaseMatrix).fCol = iVar2;
    }
  }
  return false;
}

Assistant:

bool TPZMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
	TPZMatrix<TVar> *copmat = dynamic_cast<TPZMatrix<TVar> *> (copy);
	if(!copmat) return false;
	bool result = true;
	if(fRow != copmat->fRow || fCol != copmat->fCol || fDecomposed != copmat->fDecomposed) result = false;
	if(!result)
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " did not compare ";
		LOGPZ_ERROR(loggerCheck,sout.str())
	}
	if(override && !result)
	{
		this->operator=(*copmat);
	}
	return result;
}